

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_writer.cpp
# Opt level: O3

void __thiscall duckdb::MetadataWriter::Flush(MetadataWriter *this)

{
  data_ptr_t pdVar1;
  
  if (this->offset < this->capacity) {
    pdVar1 = BasePtr(this);
    switchD_01043a80::default(pdVar1 + this->offset,0,this->capacity - this->offset);
  }
  BufferHandle::Destroy(&(this->block).handle);
  return;
}

Assistant:

void MetadataWriter::Flush() {
	if (offset < capacity) {
		// clear remaining bytes of block (if any)
		memset(Ptr(), 0, capacity - offset);
	}
	block.handle.Destroy();
}